

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O2

void InsertInterval(CostManager *manager,CostInterval *interval_in,int64_t cost,int position,
                   int start,int end)

{
  CostInterval *pCVar1;
  CostInterval *pCVar2;
  CostInterval **ppCVar3;
  CostManager *pCVar4;
  CostInterval *pCVar5;
  
  if (end <= start) {
    return;
  }
  if (499 < manager->count) {
LAB_0016e73a:
    UpdateCostPerInterval(manager,start,end,position,cost);
    return;
  }
  pCVar2 = manager->free_intervals;
  if (pCVar2 == (CostInterval *)0x0) {
    pCVar2 = manager->recycled_intervals;
    if (pCVar2 == (CostInterval *)0x0) {
      pCVar2 = (CostInterval *)WebPSafeMalloc(1,0x28);
      if (pCVar2 == (CostInterval *)0x0) goto LAB_0016e73a;
      goto LAB_0016e78d;
    }
    ppCVar3 = &manager->recycled_intervals;
  }
  else {
    ppCVar3 = &manager->free_intervals;
  }
  *ppCVar3 = pCVar2->next;
LAB_0016e78d:
  pCVar2->cost = cost;
  pCVar2->index = position;
  pCVar2->start = start;
  pCVar2->end = end;
  pCVar4 = manager;
  if (interval_in != (CostInterval *)0x0) goto LAB_0016e7ba;
  while( true ) {
    interval_in = pCVar4->head;
LAB_0016e7ba:
    if ((interval_in == (CostInterval *)0x0) || (interval_in->start <= start)) break;
    pCVar4 = (CostManager *)&interval_in->previous;
  }
  do {
    pCVar5 = interval_in;
    if (pCVar5 == (CostInterval *)0x0) {
      pCVar1 = manager->head;
      pCVar2->next = pCVar1;
      if (pCVar1 != (CostInterval *)0x0) {
        pCVar1->previous = pCVar2;
      }
LAB_0016e7fc:
      pCVar4 = (CostManager *)&pCVar5->next;
      if (pCVar5 == (CostInterval *)0x0) {
        pCVar4 = manager;
      }
      goto LAB_0016e815;
    }
    interval_in = pCVar5->next;
    if (interval_in == (CostInterval *)0x0) {
      pCVar2->next = (CostInterval *)0x0;
      goto LAB_0016e7fc;
    }
  } while (interval_in->start < start);
  pCVar2->next = interval_in;
  interval_in->previous = pCVar2;
  pCVar4 = (CostManager *)&pCVar5->next;
LAB_0016e815:
  pCVar4->head = pCVar2;
  pCVar2->previous = pCVar5;
  manager->count = manager->count + 1;
  return;
}

Assistant:

static WEBP_INLINE void InsertInterval(CostManager* const manager,
                                       CostInterval* const interval_in,
                                       int64_t cost, int position, int start,
                                       int end) {
  CostInterval* interval_new;

  if (start >= end) return;
  if (manager->count >= COST_CACHE_INTERVAL_SIZE_MAX) {
    // Serialize the interval if we cannot store it.
    UpdateCostPerInterval(manager, start, end, position, cost);
    return;
  }
  if (manager->free_intervals != NULL) {
    interval_new = manager->free_intervals;
    manager->free_intervals = interval_new->next;
  } else if (manager->recycled_intervals != NULL) {
    interval_new = manager->recycled_intervals;
    manager->recycled_intervals = interval_new->next;
  } else {  // malloc for good
    interval_new = (CostInterval*)WebPSafeMalloc(1, sizeof(*interval_new));
    if (interval_new == NULL) {
      // Write down the interval if we cannot create it.
      UpdateCostPerInterval(manager, start, end, position, cost);
      return;
    }
  }

  interval_new->cost = cost;
  interval_new->index = position;
  interval_new->start = start;
  interval_new->end = end;
  PositionOrphanInterval(manager, interval_new, interval_in);

  ++manager->count;
}